

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O0

bool __thiscall FIX::HttpParser::readHttpMessage(HttpParser *this,string *str)

{
  ulong uVar1;
  MessageParseError *this_00;
  allocator<char> local_49;
  string local_48;
  long local_28;
  size_type pos;
  string *str_local;
  HttpParser *this_local;
  
  local_28 = 0;
  pos = (size_type)str;
  str_local = &this->m_buffer;
  uVar1 = std::__cxx11::string::length();
  if (uVar1 < 4) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = std::__cxx11::string::find((char *)this,0x2dc73d);
    uVar1 = std::__cxx11::string::length();
    if (0x800 < uVar1) {
      this_00 = (MessageParseError *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
      MessageParseError::MessageParseError(this_00,&local_48);
      __cxa_throw(this_00,&MessageParseError::typeinfo,MessageParseError::~MessageParseError);
    }
    if (local_28 == -1) {
      this_local._7_1_ = false;
    }
    else {
      std::__cxx11::string::assign((string *)pos,(ulong)this,0);
      std::__cxx11::string::erase((ulong)this,0);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

EXCEPT(MessageParseError) {
  std::string::size_type pos = 0;

  if (m_buffer.length() < 4) {
    return false;
  }
  pos = m_buffer.find("\r\n\r\n");
  if (m_buffer.length() > 2048) {
    throw MessageParseError();
  }
  if (pos == std::string::npos) {
    return false;
  }
  str.assign(m_buffer, 0, pos + 4);
  m_buffer.erase(0, pos + 4);

  return true;
}